

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O2

void decodeQuantum(uchar *dest,char *src)

{
  char cVar1;
  uchar uVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  
  uVar5 = 0;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    cVar1 = *src;
    for (lVar4 = 0;
        (lVar4 != 0x40 &&
        ("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[lVar4] != cVar1));
        lVar4 = lVar4 + 1) {
    }
    if ("ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"[lVar4] == cVar1) {
      uVar5 = uVar5 * 0x40 + lVar4;
    }
    else if (cVar1 == '=') {
      uVar5 = uVar5 << 6;
    }
    src = src + 1;
  }
  uVar2 = curlx_ultouc(uVar5 & 0xff);
  dest[2] = uVar2;
  uVar2 = curlx_ultouc((ulong)((uint)(uVar5 >> 8) & 0xff));
  dest[1] = uVar2;
  uVar2 = curlx_ultouc((ulong)((uint)uVar5 >> 0x10 & 0xff));
  *dest = uVar2;
  return;
}

Assistant:

static void decodeQuantum(unsigned char *dest, const char *src)
{
  const char *s, *p;
  unsigned long i, v, x = 0;

  for(i = 0, s = src; i < 4; i++, s++) {
    v = 0;
    p = table64;
    while(*p && (*p != *s)) {
      v++;
      p++;
    }
    if(*p == *s)
      x = (x << 6) + v;
    else if(*s == '=')
      x = (x << 6);
  }

  dest[2] = curlx_ultouc(x & 0xFFUL);
  x >>= 8;
  dest[1] = curlx_ultouc(x & 0xFFUL);
  x >>= 8;
  dest[0] = curlx_ultouc(x & 0xFFUL);
}